

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O1

void coll_tmap_balance_remove(coll_tmap_t *map,entry_t_conflict *entry)

{
  coll_entry_color_t cVar1;
  coll_tmap_entry_t *pcVar2;
  entry_t_conflict *peVar3;
  coll_tmap_entry_t *pcVar4;
  coll_tmap_t *pcVar5;
  
  if (map->root != entry) {
    do {
      if (entry == (entry_t_conflict *)0x0) {
LAB_00106037:
        pcVar2 = (coll_tmap_entry_t *)0x0;
      }
      else {
        if (entry->color != '\0') break;
        if (entry == (entry_t_conflict *)0x0) goto LAB_00106037;
        pcVar2 = entry->parent;
      }
      if (pcVar2 == (coll_tmap_entry_t *)0x0) {
        peVar3 = (entry_t_conflict *)0x0;
      }
      else {
        peVar3 = pcVar2->left;
      }
      pcVar5 = map;
      if (entry == peVar3) {
        if (entry == (entry_t_conflict *)0x0) {
          pcVar2 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar2 = entry->parent;
        }
        if (pcVar2 == (coll_tmap_entry_t *)0x0) {
          pcVar2 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar2 = pcVar2->right;
        }
        if ((pcVar2 != (coll_tmap_entry_t *)0x0) && (pcVar2->color == '\x01')) {
          if (pcVar2 != (coll_tmap_entry_t *)0x0) {
            pcVar2->color = '\0';
          }
          if (entry == (entry_t_conflict *)0x0) {
            pcVar2 = (coll_tmap_entry_t *)0x0;
          }
          else {
            pcVar2 = entry->parent;
          }
          if (pcVar2 != (coll_tmap_entry_t *)0x0) {
            pcVar2->color = '\x01';
          }
          if (entry == (entry_t_conflict *)0x0) {
            entry_rotate_left(map,(entry_t_conflict *)0x0);
            pcVar2 = (coll_tmap_entry_t *)0x0;
          }
          else {
            entry_rotate_left(map,entry->parent);
            pcVar2 = entry->parent;
          }
          if (pcVar2 == (coll_tmap_entry_t *)0x0) {
            pcVar2 = (entry_t_conflict *)0x0;
          }
          else {
            pcVar2 = pcVar2->right;
          }
        }
        if (pcVar2 == (entry_t_conflict *)0x0) {
          pcVar4 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar4 = pcVar2->left;
        }
        if ((pcVar4 == (coll_tmap_entry_t *)0x0) || (pcVar4->color == '\0')) {
          if (pcVar2 == (entry_t_conflict *)0x0) {
            pcVar4 = (coll_tmap_entry_t *)0x0;
          }
          else {
            pcVar4 = pcVar2->right;
          }
          if ((pcVar4 == (coll_tmap_entry_t *)0x0) || (pcVar4->color == '\0')) goto LAB_0010627d;
        }
        if (pcVar2 == (entry_t_conflict *)0x0) {
          pcVar4 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar4 = pcVar2->right;
        }
        if ((pcVar4 == (coll_tmap_entry_t *)0x0) || (pcVar4->color == '\0')) {
          if (pcVar2 == (entry_t_conflict *)0x0) {
            pcVar4 = (coll_tmap_entry_t *)0x0;
          }
          else {
            pcVar4 = pcVar2->left;
          }
          if (pcVar4 != (coll_tmap_entry_t *)0x0) {
            pcVar4->color = '\0';
          }
          if (pcVar2 != (entry_t_conflict *)0x0) {
            pcVar2->color = '\x01';
          }
          entry_rotate_right(map,pcVar2);
          if (entry == (entry_t_conflict *)0x0) {
            pcVar2 = (coll_tmap_entry_t *)0x0;
          }
          else {
            pcVar2 = entry->parent;
          }
          if (pcVar2 == (coll_tmap_entry_t *)0x0) {
            pcVar2 = (coll_tmap_entry_t *)0x0;
          }
          else {
            pcVar2 = pcVar2->right;
          }
        }
        if (entry == (entry_t_conflict *)0x0) {
          pcVar4 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar4 = entry->parent;
        }
        if (pcVar4 == (coll_tmap_entry_t *)0x0) {
          cVar1 = '\0';
        }
        else {
          cVar1 = pcVar4->color;
        }
        if (pcVar2 != (coll_tmap_entry_t *)0x0) {
          pcVar2->color = cVar1;
        }
        if (entry == (entry_t_conflict *)0x0) {
          pcVar4 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar4 = entry->parent;
        }
        if (pcVar4 != (coll_tmap_entry_t *)0x0) {
          pcVar4->color = '\0';
        }
        if (pcVar2 == (coll_tmap_entry_t *)0x0) {
          pcVar2 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar2 = pcVar2->right;
        }
        if (pcVar2 != (coll_tmap_entry_t *)0x0) {
          pcVar2->color = '\0';
        }
        if (entry == (entry_t_conflict *)0x0) {
          pcVar2 = (entry_t_conflict *)0x0;
        }
        else {
          pcVar2 = entry->parent;
        }
        entry_rotate_left(map,pcVar2);
LAB_0010634f:
        entry = pcVar5->root;
      }
      else {
        if (entry == (entry_t_conflict *)0x0) {
          pcVar2 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar2 = entry->parent;
        }
        if (pcVar2 == (coll_tmap_entry_t *)0x0) {
          pcVar2 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar2 = pcVar2->left;
        }
        if ((pcVar2 != (coll_tmap_entry_t *)0x0) && (pcVar2->color == '\x01')) {
          if (pcVar2 != (coll_tmap_entry_t *)0x0) {
            pcVar2->color = '\0';
          }
          if (entry == (entry_t_conflict *)0x0) {
            pcVar2 = (coll_tmap_entry_t *)0x0;
          }
          else {
            pcVar2 = entry->parent;
          }
          if (pcVar2 != (coll_tmap_entry_t *)0x0) {
            pcVar2->color = '\x01';
          }
          if (entry == (entry_t_conflict *)0x0) {
            entry_rotate_right(map,(entry_t_conflict *)0x0);
            pcVar2 = (coll_tmap_entry_t *)0x0;
          }
          else {
            entry_rotate_right(map,entry->parent);
            pcVar2 = entry->parent;
          }
          if (pcVar2 == (coll_tmap_entry_t *)0x0) {
            pcVar2 = (entry_t_conflict *)0x0;
          }
          else {
            pcVar2 = pcVar2->left;
          }
        }
        if (pcVar2 == (entry_t_conflict *)0x0) {
          pcVar4 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar4 = pcVar2->right;
        }
        if ((pcVar4 != (coll_tmap_entry_t *)0x0) && (pcVar4->color != '\0')) {
LAB_00106147:
          if (pcVar2 == (entry_t_conflict *)0x0) {
            pcVar4 = (coll_tmap_entry_t *)0x0;
          }
          else {
            pcVar4 = pcVar2->left;
          }
          if ((pcVar4 == (coll_tmap_entry_t *)0x0) || (pcVar4->color == '\0')) {
            if (pcVar2 == (entry_t_conflict *)0x0) {
              pcVar4 = (coll_tmap_entry_t *)0x0;
            }
            else {
              pcVar4 = pcVar2->right;
            }
            if (pcVar4 != (coll_tmap_entry_t *)0x0) {
              pcVar4->color = '\0';
            }
            if (pcVar2 != (entry_t_conflict *)0x0) {
              pcVar2->color = '\x01';
            }
            entry_rotate_left(map,pcVar2);
            if (entry == (entry_t_conflict *)0x0) {
              pcVar2 = (coll_tmap_entry_t *)0x0;
            }
            else {
              pcVar2 = entry->parent;
            }
            if (pcVar2 == (coll_tmap_entry_t *)0x0) {
              pcVar2 = (coll_tmap_entry_t *)0x0;
            }
            else {
              pcVar2 = pcVar2->left;
            }
          }
          if (entry == (entry_t_conflict *)0x0) {
            pcVar4 = (coll_tmap_entry_t *)0x0;
          }
          else {
            pcVar4 = entry->parent;
          }
          if (pcVar4 == (coll_tmap_entry_t *)0x0) {
            cVar1 = '\0';
          }
          else {
            cVar1 = pcVar4->color;
          }
          if (pcVar2 != (coll_tmap_entry_t *)0x0) {
            pcVar2->color = cVar1;
          }
          if (entry == (entry_t_conflict *)0x0) {
            pcVar4 = (coll_tmap_entry_t *)0x0;
          }
          else {
            pcVar4 = entry->parent;
          }
          if (pcVar4 != (coll_tmap_entry_t *)0x0) {
            pcVar4->color = '\0';
          }
          if (pcVar2 == (coll_tmap_entry_t *)0x0) {
            pcVar2 = (coll_tmap_entry_t *)0x0;
          }
          else {
            pcVar2 = pcVar2->left;
          }
          if (pcVar2 != (coll_tmap_entry_t *)0x0) {
            pcVar2->color = '\0';
          }
          if (entry == (entry_t_conflict *)0x0) {
            pcVar2 = (entry_t_conflict *)0x0;
          }
          else {
            pcVar2 = entry->parent;
          }
          entry_rotate_right(map,pcVar2);
          goto LAB_0010634f;
        }
        if (pcVar2 == (entry_t_conflict *)0x0) {
          pcVar4 = (coll_tmap_entry_t *)0x0;
        }
        else {
          pcVar4 = pcVar2->left;
        }
        if ((pcVar4 != (coll_tmap_entry_t *)0x0) && (pcVar4->color != '\0')) goto LAB_00106147;
LAB_0010627d:
        if (pcVar2 != (entry_t_conflict *)0x0) {
          pcVar2->color = '\x01';
        }
        if (entry != (entry_t_conflict *)0x0) {
          pcVar5 = (coll_tmap_t *)&entry->parent;
          goto LAB_0010634f;
        }
        entry = (coll_tmap_entry_t *)0x0;
      }
    } while (entry != map->root);
  }
  if (entry != (entry_t_conflict *)0x0) {
    entry->color = '\0';
  }
  return;
}

Assistant:

static void coll_tmap_balance_remove(coll_tmap_t *map, entry_t *entry) {
    while (entry != map->root && color(entry) == BLACK) {
        if (entry == left(parent(entry))) {
            entry_t *sib = right(parent(entry));  // sibling

            if (color(sib) == RED) {
                dye(sib, BLACK);
                dye(parent(entry), RED);
                entry_rotate_left(map, parent(entry));
                sib = right(parent(entry));
            }

            if (color(left(sib)) == BLACK && color(right(sib)) == BLACK) {
                dye(sib, RED);
                entry = parent(entry);
            } else {
                if (color(right(sib)) == BLACK) {
                    dye(left(sib), BLACK);
                    dye(sib, RED);
                    entry_rotate_right(map, sib);
                    sib = right(parent(entry));
                }
                dye(sib, color(parent(entry)));
                dye(parent(entry), BLACK);
                dye(right(sib), BLACK);
                entry_rotate_left(map, parent(entry));
                entry = map->root;
            }
        } else {
            entry_t *sib = left(parent(entry));

            if (color(sib) == RED) {
                dye(sib, BLACK);
                dye(parent(entry), RED);
                entry_rotate_right(map, parent(entry));
                sib = left(parent(entry));
            }

            if (color(right(sib)) == BLACK && color(left(sib)) == BLACK) {
                dye(sib, RED);
                entry = parent(entry);
            } else {
                if (color(left(sib)) == BLACK) {
                    dye(right(sib), BLACK);
                    dye(sib, RED);
                    entry_rotate_left(map, sib);
                    sib = left(parent(entry));
                }
                dye(sib, color(parent(entry)));
                dye(parent(entry), BLACK);
                dye(left(sib), BLACK);
                entry_rotate_right(map, parent(entry));
                entry = map->root;
            }
        }
    }
    dye(entry, BLACK);
}